

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

ConstIterator __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::find(ChannelGroupManifest *this,uint64_t idValue)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  
  p_Var2 = (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cVar1._M_node = &(this->_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  cVar3._M_node = cVar1._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var2 + 1) >= idValue) {
        cVar3._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < idValue];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((cVar3._M_node != cVar1._M_node) && (*(ulong *)(cVar3._M_node + 1) <= idValue)) {
      cVar1._M_node = cVar3._M_node;
    }
  }
  return (ConstIterator)cVar1._M_node;
}

Assistant:

IDManifest::ChannelGroupManifest::ConstIterator
IDManifest::ChannelGroupManifest::find (uint64_t idValue) const
{
    return IDManifest::ChannelGroupManifest::ConstIterator (
        _table.find (idValue));
}